

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

unsigned_long
pstore::serialize::
read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
          (range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *archive)

{
  unique_ptr<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_30;
  unique_ptr<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  T2 *t2;
  type uninit_buffer;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *archive_local;
  
  uninit_buffer._ = (uint8_t  [8])archive;
  flood<pstore::serialize::details::aligned_storage<8ul,8ul>::type>((type *)&t2);
  read_uninit<pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&,unsigned_long>
            ((range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)uninit_buffer._,(unsigned_long *)&t2);
  std::
  unique_ptr<unsigned_long,pstore::serialize::read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>(pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&)::{lambda(unsigned_long*)#1}>
  ::
  unique_ptr<pstore::serialize::read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>(pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&)::_lambda(unsigned_long*)_1_,void>
            ((unique_ptr<unsigned_long,pstore::serialize::read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>(pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&)::_lambda(unsigned_long*)_1_>
              *)&local_30,(pointer)&t2,
             (deleter_type *)
             ((long)&d._M_t.
                     super___uniq_ptr_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     ._M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 7));
  std::
  unique_ptr<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr(&local_30);
  return (unsigned_long)t2;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }